

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
::write_int<unsigned_long,fmt::v5::basic_format_specs<char>>
          (basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
           *this,unsigned_long value,basic_format_specs<char> *spec)

{
  int_writer<unsigned_long,_fmt::v5::basic_format_specs<char>_> local_20;
  
  local_20.prefix_size = 0;
  if ((spec->flags_ & 1) != 0) {
    local_20.prefix[0] = '+';
    if ((spec->flags_ & 2) == 0) {
      local_20.prefix[0] = ' ';
    }
    local_20.prefix_size = 1;
  }
  local_20.writer =
       (basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)this;
  local_20.spec = spec;
  local_20.abs_value = value;
  internal::
  handle_int_type_spec<char,fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>::int_writer<unsigned_long,fmt::v5::basic_format_specs<char>>>
            (spec->type_,&local_20);
  return;
}

Assistant:

void write_int(T value, const Spec &spec) {
    internal::handle_int_type_spec(spec.type(),
                                   int_writer<T, Spec>(*this, value, spec));
  }